

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

void fiobj_data_pre_write(FIOBJ o,uintptr_t length)

{
  void *__src;
  FIOBJ o_00;
  int iVar1;
  void *pvVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  fio_str_info_s local_48;
  
  if (*(int *)(o + 0x30) == -2) {
    if (*(int *)(*(long *)(o + 0x10) + 0x30) == -1) {
      pvVar2 = fio_malloc(*(long *)(o + 0x20) + 1);
      *(void **)(o + 8) = pvVar2;
      o_00 = *(FIOBJ *)(o + 0x10);
      sVar7 = *(size_t *)(o + 0x20);
      memcpy(pvVar2,(void *)(*(long *)(o_00 + 8) + *(long *)(o + 0x18)),sVar7);
      *(undefined1 *)((long)pvVar2 + sVar7) = 0;
      *(size_t *)(o + 0x18) = sVar7;
      *(undefined4 *)(o + 0x30) = 0xffffffff;
      fiobj_free(o_00);
      *(code **)(o + 0x10) = fio_free;
    }
    else {
      iVar1 = fio_tmpfile();
      *(int *)(o + 0x30) = iVar1;
      if (iVar1 < 0) {
        pcVar6 = "FATAL ERROR: (fiobj_data) can\'t create temporary file";
        goto LAB_0013a7a3;
      }
      lVar8 = 0;
      do {
        fiobj_data_pread(&local_48,*(FIOBJ *)(o + 0x10),*(long *)(o + 0x18) + lVar8,0x1000);
        pcVar6 = local_48.data;
        sVar7 = *(ulong *)(o + 0x20) - lVar8;
        if (local_48.len + lVar8 <= *(ulong *)(o + 0x20)) {
          sVar7 = local_48.len;
        }
        while (sVar3 = write(*(int *)(o + 0x30),pcVar6,sVar7), sVar3 < 0) {
          piVar4 = __errno_location();
          if (*piVar4 != 4) {
            perror("FATAL ERROR: (fiobj_data) can\'t write to temporary file");
            exit(*piVar4);
          }
        }
        lVar8 = lVar8 + sVar3;
      } while (sVar7 == 0x1000);
      fiobj_free(*(FIOBJ *)(o + 0x10));
      *(undefined8 *)(o + 0x18) = 0;
      *(long *)(o + 0x20) = lVar8;
      *(undefined8 *)(o + 0x10) = *(undefined8 *)(o + 0x28);
      *(undefined8 *)(o + 0x28) = 0;
      *(undefined8 *)(o + 8) = 0;
    }
LAB_0013a73c:
    uVar9 = length + *(long *)(o + 0x20);
    if (uVar9 <= *(ulong *)(o + 0x18)) {
      return;
    }
    sVar5 = (uVar9 & 0xfffffffffffff000) + 0x1000;
    *(size_t *)(o + 0x18) = sVar5;
    pvVar2 = fio_realloc(*(void **)(o + 8),sVar5);
    *(void **)(o + 8) = pvVar2;
    if (pvVar2 != (void *)0x0) {
      return;
    }
  }
  else {
    if ((*(int *)(o + 0x30) != -1) || (*(code **)(o + 0x10) == fio_free)) goto LAB_0013a73c;
    sVar5 = (*(ulong *)(o + 0x20) & 0xfffffffffffff000) + 0x1000;
    *(size_t *)(o + 0x18) = sVar5;
    pvVar2 = fio_malloc(sVar5);
    if (pvVar2 != (void *)0x0) {
      __src = *(void **)(o + 8);
      memcpy(pvVar2,__src,*(size_t *)(o + 0x20));
      if (*(code **)(o + 0x10) != (code *)0x0) {
        (**(code **)(o + 0x10))(__src);
      }
      *(code **)(o + 0x10) = fio_free;
      *(void **)(o + 8) = pvVar2;
      goto LAB_0013a73c;
    }
  }
  pcVar6 = "FATAL ERROR: fiobj IO couldn\'t allocate memory";
LAB_0013a7a3:
  perror(pcVar6);
  piVar4 = __errno_location();
  exit(*piVar4);
}

Assistant:

static inline void fiobj_data_pre_write(FIOBJ o, uintptr_t length) {
  switch (obj2io(o)->fd) {
  case -1:
    if (obj2io(o)->source.dealloc != fio_free) {
      fiobj_data_copy_buffer(o);
    }
    break;
  case -2:
    fiobj_data_copy_parent(o);
    break;
  }
  if (obj2io(o)->capa >= obj2io(o)->len + length)
    return;
  /* add rounded pages (4096) to capacity */
  obj2io(o)->capa = (((obj2io(o)->len + length) >> 12) + 1) << 12;
  obj2io(o)->buffer = fio_realloc(obj2io(o)->buffer, obj2io(o)->capa);
  REQUIRE_MEM(obj2io(o)->buffer);
}